

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O2

void DownHeap(INT32 Index)

{
  short sVar1;
  uint uVar2;
  UINT16 *pUVar3;
  INT32 IVar4;
  uint uVar5;
  
  IVar4 = mHeapSize;
  pUVar3 = mFreq;
  sVar1 = mHeap[(uint)Index];
  while( true ) {
    uVar2 = Index * 2;
    if (IVar4 < (int)uVar2) break;
    uVar5 = uVar2;
    if (((int)uVar2 < IVar4) &&
       (uVar5 = uVar2 | 1, pUVar3[mHeap[uVar2]] <= pUVar3[mHeap[uVar2 | 1]])) {
      uVar5 = uVar2;
    }
    if (pUVar3[sVar1] <= pUVar3[mHeap[uVar5]]) break;
    mHeap[(uint)Index] = mHeap[uVar5];
    Index = uVar5;
  }
  mHeap[(uint)Index] = sVar1;
  return;
}

Assistant:

STATIC 
VOID 
DownHeap (
  IN INT32 i
  )
{
  INT32 j, k;

  //
  // priority queue: send i-th entry down heap
  //
  
  k = mHeap[i];
  while ((j = 2 * i) <= mHeapSize) {
    if (j < mHeapSize && mFreq[mHeap[j]] > mFreq[mHeap[j + 1]]) {
      j++;
    }
    if (mFreq[k] <= mFreq[mHeap[j]]) {
      break;
    }
    mHeap[i] = mHeap[j];
    i = j;
  }
  mHeap[i] = (INT16)k;
}